

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O3

int AF_A_SoAExplode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  PClassActor *pPVar8;
  AActor *this;
  AActor *ent;
  long lVar9;
  char *__assertion;
  bool bVar10;
  DVector2 v;
  FName local_6c;
  double local_68;
  double local_60;
  double local_58;
  FSoundID local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e37a0;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_005e347b:
        ent = (AActor *)0x0;
      }
      else {
        pPVar7 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
          (ent->super_DThinker).super_DObject.Class = pPVar7;
        }
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e37a0;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e353b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e3790;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar7 = (PClass *)puVar2[1];
            if (pPVar7 == (PClass *)0x0) {
              pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar7;
            }
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar3 && bVar10) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar10 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar3) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e37a0;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e3790;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e353b:
        lVar9 = 0;
        do {
          uVar5 = FRandom::GenRand32(&pr_soaexplode);
          local_58 = (double)(int)((uVar5 & 0xff) - 0x80) * 0.0625;
          uVar5 = FRandom::GenRand32(&pr_soaexplode);
          local_60 = (double)(int)((uVar5 & 0xff) - 0x80) * 0.0625;
          uVar5 = FRandom::GenRand32(&pr_soaexplode);
          local_68 = (double)(uVar5 & 0xff) * ent->Height * 0.00390625;
          iVar4 = FName::NameManager::FindName(&FName::NameData,"ZArmorChunk",false);
          P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,local_58,local_60);
          local_48.Z = local_68 + (ent->__Pos).Z;
          local_6c.Index = iVar4;
          pPVar8 = ClassForSpawn(&local_6c);
          this = AActor::StaticSpawn(pPVar8,&local_48,ALLOW_REPLACE,false);
          if (this != (AActor *)0x0) {
            AActor::SetState(this,(FState *)((long)&this->SpawnState->NextState + lVar9),false);
            uVar5 = FRandom::GenRand32(&pr_soaexplode);
            uVar6 = FRandom::GenRand32(&pr_soaexplode);
            (this->Vel).X = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625;
            uVar5 = FRandom::GenRand32(&pr_soaexplode);
            uVar6 = FRandom::GenRand32(&pr_soaexplode);
            (this->Vel).Y = (double)(int)((uVar5 & 0xff) - (uVar6 & 0xff)) * 0.015625;
            uVar5 = FRandom::GenRand32(&pr_soaexplode);
            (this->Vel).Z = (double)((uVar5 & 7) + 5);
          }
          lVar9 = lVar9 + 0x28;
        } while (lVar9 != 400);
        pPVar8 = P_GetSpawnableType(ent->args[0]);
        if ((pPVar8 != (PClassActor *)0x0) &&
           ((((level.flags2._1_1_ & 0x80) == 0 && ((dmflags.Value._1_1_ & 0x10) == 0)) ||
            (((pPVar8->super_PClass).Defaults[0x195] & 0x20) == 0)))) {
          local_48.X = (ent->__Pos).X;
          local_48.Y = (ent->__Pos).Y;
          local_48.Z = (ent->__Pos).Z;
          AActor::StaticSpawn(pPVar8,&local_48,ALLOW_REPLACE,false);
        }
        local_4c.ID = (ent->DeathSound).super_FSoundID.ID;
        S_Sound(ent,4,&local_4c,1.0,1.0);
        (*(ent->super_DThinker).super_DObject._vptr_DObject[4])(ent);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e37a0;
    }
    if (ent == (AActor *)0x0) goto LAB_005e347b;
  }
LAB_005e3790:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e37a0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SoAExplode)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = 0; i < 10; i++)
	{
		double xo = (pr_soaexplode() - 128) / 16.;
		double yo = (pr_soaexplode() - 128) / 16.;
		double zo = pr_soaexplode()*self->Height / 256.;
		mo = Spawn ("ZArmorChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + i);
			mo->Vel.X = pr_soaexplode.Random2() / 64.;
			mo->Vel.Y = pr_soaexplode.Random2() / 64.;
			mo->Vel.Z = (pr_soaexplode() & 7) + 5;
		}
	}
	// Spawn an item?
	PClassActor *type = P_GetSpawnableType(self->args[0]);
	if (type != NULL)
	{
		if (!((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS))
		|| !(GetDefaultByType (type)->flags3 & MF3_ISMONSTER))
		{ // Only spawn monsters if not -nomonsters
			Spawn (type, self->Pos(), ALLOW_REPLACE);
		}
	}
	S_Sound (self, CHAN_BODY, self->DeathSound, 1, ATTN_NORM);
	self->Destroy ();
	return 0;
}